

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

CTransactionRef
node::GetTransaction
          (CBlockIndex *block_index,CTxMemPool *mempool,uint256 *hash,uint256 *hashBlock,
          BlockManager *blockman)

{
  long lVar1;
  bool bVar2;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  long in_RSI;
  element_type *in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  CTransactionRef CVar4;
  shared_ptr<const_CTransaction> *tx_1;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range3;
  CTransactionRef *ptx;
  iterator __end3;
  iterator __begin3;
  CBlock block;
  uint256 block_hash;
  CTransaction *in_stack_fffffffffffffe78;
  base_blob<256U> *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  bool local_15a;
  uint256 *in_stack_fffffffffffffeb8;
  CTxMemPool *in_stack_fffffffffffffec0;
  CBlockIndex *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  byte in_stack_fffffffffffffedf;
  undefined4 in_stack_fffffffffffffee0;
  uint uVar5;
  int iVar6;
  uint in_stack_fffffffffffffee4;
  undefined8 local_d8;
  CTransactionRef *in_stack_ffffffffffffff30;
  uint256 *in_stack_ffffffffffffff38;
  uint256 *in_stack_ffffffffffffff40;
  TxIndex *in_stack_ffffffffffffff48;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDX != 0) && (in_RSI == 0)) {
    in_stack_fffffffffffffee4 = in_stack_fffffffffffffee4 & 0xffffff;
    CTxMemPool::get(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                       in_stack_fffffffffffffe78);
    if (bVar2) {
      in_stack_fffffffffffffee4 = CONCAT13(1,(int3)in_stack_fffffffffffffee4);
    }
    uVar5 = (uint)bVar2;
    _Var3._M_pi = extraout_RDX;
    if ((in_stack_fffffffffffffee4 & 0x1000000) == 0) {
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffe78);
      _Var3._M_pi = extraout_RDX_00;
    }
    if (uVar5 != 0) goto LAB_004de2a3;
    in_stack_fffffffffffffee0 = 0;
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<TxIndex,_std::default_delete<TxIndex>_> *)in_stack_fffffffffffffe78
                    );
  if (bVar2) {
    in_stack_fffffffffffffedf = 0;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffe78);
    uint256::uint256((uint256 *)in_stack_fffffffffffffe78);
    std::unique_ptr<TxIndex,_std::default_delete<TxIndex>_>::operator->
              ((unique_ptr<TxIndex,_std::default_delete<TxIndex>_> *)in_stack_fffffffffffffe78);
    bVar2 = TxIndex::FindTx(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                            in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    _Var3._M_pi = extraout_RDX_01;
    if (bVar2) {
      local_15a = true;
      if (in_RSI != 0) {
        CBlockIndex::GetBlockHash
                  ((CBlockIndex *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
        local_15a = ::operator==((base_blob<256U> *)
                                 CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                                 in_stack_fffffffffffffe80);
        _Var3._M_pi = extraout_RDX_02;
      }
      if (local_15a == false) goto LAB_004de0bd;
      *in_R8 = local_28;
      in_R8[1] = local_20;
      in_R8[2] = local_18;
      in_R8[3] = local_10;
      in_stack_fffffffffffffedf = 1;
      iVar6 = 1;
    }
    else {
LAB_004de0bd:
      iVar6 = 0;
    }
    if ((in_stack_fffffffffffffedf & 1) == 0) {
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffe78);
      _Var3._M_pi = extraout_RDX_03;
    }
    if (iVar6 != 0) goto LAB_004de2a3;
    in_stack_fffffffffffffee0 = 0;
  }
  if (in_RSI != 0) {
    CBlock::CBlock((CBlock *)&stack0xffffffffffffff48);
    bVar2 = BlockManager::ReadBlockFromDisk
                      ((BlockManager *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                       ,(CBlock *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                       in_stack_fffffffffffffed0);
    if (bVar2) {
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)in_stack_fffffffffffffe80);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_fffffffffffffe80);
      while (bVar2 = __gnu_cxx::
                     operator==<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                               ((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                                (__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                 *)in_stack_fffffffffffffe80), ((bVar2 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
        ::operator*((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                     *)in_stack_fffffffffffffe78);
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffffe78);
        CTransaction::GetHash(in_stack_fffffffffffffe78);
        in_stack_fffffffffffffe8f =
             transaction_identifier<false>::operator==
                       ((transaction_identifier<false> *)
                        CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                        (uint256 *)in_stack_fffffffffffffe80);
        if ((bool)in_stack_fffffffffffffe8f) {
          CBlockIndex::GetBlockHash
                    ((CBlockIndex *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
          *in_R8 = local_d8;
          in_R8[1] = in_stack_ffffffffffffff30;
          in_R8[2] = in_stack_ffffffffffffff38;
          in_R8[3] = in_stack_ffffffffffffff40;
          std::shared_ptr<const_CTransaction>::shared_ptr
                    ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffe78,
                     (shared_ptr<const_CTransaction> *)0x4de231);
          iVar6 = 1;
          goto LAB_004de27a;
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
        ::operator++((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                      *)in_stack_fffffffffffffe78);
      }
    }
    iVar6 = 0;
LAB_004de27a:
    CBlock::~CBlock((CBlock *)in_stack_fffffffffffffe78);
    _Var3._M_pi = extraout_RDX_04;
    if (iVar6 != 0) goto LAB_004de2a3;
  }
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffe78,(nullptr_t)0x4de2a3);
  _Var3._M_pi = extraout_RDX_05;
LAB_004de2a3:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (CTransactionRef)CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CTransactionRef GetTransaction(const CBlockIndex* const block_index, const CTxMemPool* const mempool, const uint256& hash, uint256& hashBlock, const BlockManager& blockman)
{
    if (mempool && !block_index) {
        CTransactionRef ptx = mempool->get(hash);
        if (ptx) return ptx;
    }
    if (g_txindex) {
        CTransactionRef tx;
        uint256 block_hash;
        if (g_txindex->FindTx(hash, block_hash, tx)) {
            if (!block_index || block_index->GetBlockHash() == block_hash) {
                // Don't return the transaction if the provided block hash doesn't match.
                // The case where a transaction appears in multiple blocks (e.g. reorgs or
                // BIP30) is handled by the block lookup below.
                hashBlock = block_hash;
                return tx;
            }
        }
    }
    if (block_index) {
        CBlock block;
        if (blockman.ReadBlockFromDisk(block, *block_index)) {
            for (const auto& tx : block.vtx) {
                if (tx->GetHash() == hash) {
                    hashBlock = block_index->GetBlockHash();
                    return tx;
                }
            }
        }
    }
    return nullptr;
}